

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerCPP::compile_abi_cxx11_(string *__return_storage_ptr__,CompilerCPP *this)

{
  StringStream<4096UL,_4096UL> *this_00;
  bool bVar1;
  SPIRFunction *func;
  SPIREntryPoint *pSVar2;
  uint32_t iteration_count;
  Bitset local_78;
  
  ParsedIR::fixup_reserved_names(&(this->super_CompilerGLSL).super_Compiler.ir);
  (this->super_CompilerGLSL).options.es = false;
  (this->super_CompilerGLSL).options.version = 0x1c2;
  (this->super_CompilerGLSL).backend.float_literal_suffix = true;
  (this->super_CompilerGLSL).backend.double_literal_suffix = false;
  (this->super_CompilerGLSL).backend.uint32_t_literal_suffix = true;
  (this->super_CompilerGLSL).backend.long_long_literal_suffix = true;
  (this->super_CompilerGLSL).backend.basic_int_type = "int32_t";
  (this->super_CompilerGLSL).backend.basic_uint_type = "uint32_t";
  (this->super_CompilerGLSL).backend.swizzle_is_function = true;
  (this->super_CompilerGLSL).backend.shared_is_implied = true;
  (this->super_CompilerGLSL).backend.unsized_array_supported = false;
  (this->super_CompilerGLSL).backend.explicit_struct_type = true;
  (this->super_CompilerGLSL).backend.use_initializer_list = true;
  CompilerGLSL::fixup_type_alias(&this->super_CompilerGLSL);
  CompilerGLSL::reorder_type_alias(&this->super_CompilerGLSL);
  Compiler::build_function_control_flow_graphs_and_analyze((Compiler *)this);
  Compiler::update_active_builtins((Compiler *)this);
  this_00 = &(this->super_CompilerGLSL).buffer;
  iteration_count = 0;
  do {
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::clear(&this->resource_registrations);
    CompilerGLSL::reset(&this->super_CompilerGLSL,iteration_count);
    StringStream<4096UL,_4096UL>::reset(this_00);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0xe])(this);
    emit_resources(this);
    func = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
    local_78.lower = 0;
    local_78.higher._M_h._M_buckets = &local_78.higher._M_h._M_single_bucket;
    local_78.higher._M_h._M_bucket_count = 1;
    local_78.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_78.higher._M_h._M_element_count = 0;
    local_78.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_78.higher._M_h._M_rehash_policy._4_4_ = 0;
    local_78.higher._M_h._M_rehash_policy._M_next_resize = 0;
    local_78.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    CompilerGLSL::emit_function(&this->super_CompilerGLSL,func,&local_78);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_78.higher._M_h);
    iteration_count = iteration_count + 1;
    bVar1 = Compiler::is_forcing_recompilation((Compiler *)this);
  } while (bVar1);
  CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  emit_c_linkage(this);
  pSVar2 = Compiler::get_entry_point((Compiler *)this);
  ::std::__cxx11::string::_M_replace
            ((ulong)&pSVar2->name,0,(char *)(pSVar2->name)._M_string_length,0x34c0e5);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

string CompilerCPP::compile()
{
	ir.fixup_reserved_names();

	// Do not deal with ES-isms like precision, older extensions and such.
	options.es = false;
	options.version = 450;
	backend.float_literal_suffix = true;
	backend.double_literal_suffix = false;
	backend.long_long_literal_suffix = true;
	backend.uint32_t_literal_suffix = true;
	backend.basic_int_type = "int32_t";
	backend.basic_uint_type = "uint32_t";
	backend.swizzle_is_function = true;
	backend.shared_is_implied = true;
	backend.unsized_array_supported = false;
	backend.explicit_struct_type = true;
	backend.use_initializer_list = true;

	fixup_type_alias();
	reorder_type_alias();
	build_function_control_flow_graphs_and_analyze();
	update_active_builtins();

	uint32_t pass_count = 0;
	do
	{
		resource_registrations.clear();
		reset(pass_count);

		// Move constructor for this type is broken on GCC 4.9 ...
		buffer.reset();

		emit_header();
		emit_resources();

		emit_function(get<SPIRFunction>(ir.default_entry_point), Bitset());

		pass_count++;
	} while (is_forcing_recompilation());

	// Match opening scope of emit_header().
	end_scope_decl();
	// namespace
	end_scope();

	// Emit C entry points
	emit_c_linkage();

	// Entry point in CPP is always main() for the time being.
	get_entry_point().name = "main";

	return buffer.str();
}